

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O2

void __thiscall
glcts::TextureBufferActiveUniformValidationCS::configureProgram
          (TextureBufferActiveUniformValidationCS *this,
          vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params,
          GLuint *texIds)

{
  pointer pTVar1;
  int iVar2;
  deUint32 err;
  uint uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  
  iVar2 = (*((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  uVar3 = 0;
  while( true ) {
    uVar4 = (ulong)uVar3;
    pTVar1 = (params->
             super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(params->
                       super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x30) <= uVar4)
    break;
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x80))
              (uVar3,texIds[uVar4],0,0,0,0x88b9,pTVar1[uVar4].m_texture_format);
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"Error binding texture to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x2b1);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void TextureBufferActiveUniformValidationCS::configureProgram(std::vector<TextureParameters>* params,
															  glw::GLuint*					  texIds)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (glw::GLuint i = 0; i < params->size(); ++i)
	{
		gl.bindImageTexture(i, texIds[i], 0, GL_FALSE, 0, GL_WRITE_ONLY, (*params)[i].get_texture_format());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture to image unit!");
	}
}